

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIScrollBar.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIScrollBar::draw(CGUIScrollBar *this)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  IGUIElement *pIVar7;
  undefined8 uVar8;
  CGUIScrollBar *in_RDI;
  f32 a;
  SColor iconColor;
  IGUISkin *skin;
  CGUIScrollBar *in_stack_00000180;
  int local_18;
  SColor local_14;
  IGUIElement *pIVar9;
  
  if (((in_RDI->field_0xa0 & 1) != 0) &&
     (pIVar7 = (IGUIElement *)(**(code **)(**(long **)&in_RDI->field_0x128 + 0x60))(),
     pIVar7 != (IGUIElement *)0x0)) {
    pIVar9 = pIVar7;
    bVar4 = (**(code **)(*(long *)in_RDI + 0x90))();
    uVar8 = 0x15;
    if ((bVar4 & 1) != 0) {
      uVar8 = 0x12;
    }
    local_14.color = (**(pIVar7->super_IEventReceiver)._vptr_IEventReceiver)(pIVar7,uVar8);
    bVar5 = video::SColor::operator!=(&local_14,&in_RDI->CurrentIconColor);
    if (bVar5) {
      refreshControls(in_stack_00000180);
    }
    uVar3 = *(undefined4 *)&in_RDI->field_0x44;
    (in_RDI->SliderRect).UpperLeftCorner.X = *(undefined4 *)&in_RDI->field_0x40;
    (in_RDI->SliderRect).UpperLeftCorner.Y = uVar3;
    uVar3 = *(undefined4 *)&in_RDI->field_0x4c;
    (in_RDI->SliderRect).LowerRightCorner.X = *(undefined4 *)&in_RDI->field_0x48;
    (in_RDI->SliderRect).LowerRightCorner.Y = uVar3;
    pIVar7 = pIVar9;
    local_18 = (**(pIVar9->super_IEventReceiver)._vptr_IEventReceiver)(pIVar9,0x10);
    (*(pIVar9->super_IEventReceiver)._vptr_IEventReceiver[0x15])
              (pIVar9,in_RDI,&local_18,&in_RDI->SliderRect,&in_RDI->field_0x50);
    a = range(in_RDI);
    bVar5 = core::isnotzero(a,1e-06);
    if (bVar5) {
      if ((in_RDI->Horizontal & 1U) == 0) {
        iVar1 = *(int *)&in_RDI->field_0x44;
        iVar2 = in_RDI->DrawPos;
        iVar6 = core::rect<int>::getWidth((rect<int> *)&in_RDI->field_0x30);
        (in_RDI->SliderRect).UpperLeftCorner.Y = (iVar1 + iVar2 + iVar6) - in_RDI->DrawHeight / 2;
        (in_RDI->SliderRect).LowerRightCorner.Y =
             (in_RDI->SliderRect).UpperLeftCorner.Y + in_RDI->DrawHeight;
      }
      else {
        iVar1 = *(int *)&in_RDI->field_0x40;
        iVar2 = in_RDI->DrawPos;
        iVar6 = core::rect<int>::getHeight((rect<int> *)&in_RDI->field_0x30);
        (in_RDI->SliderRect).UpperLeftCorner.X = (iVar1 + iVar2 + iVar6) - in_RDI->DrawHeight / 2;
        (in_RDI->SliderRect).LowerRightCorner.X =
             (in_RDI->SliderRect).UpperLeftCorner.X + in_RDI->DrawHeight;
      }
      (*(pIVar7->super_IEventReceiver)._vptr_IEventReceiver[0xc])
                (pIVar7,in_RDI,&in_RDI->SliderRect,&in_RDI->field_0x50);
    }
    IGUIElement::draw(pIVar7);
  }
  return;
}

Assistant:

void CGUIScrollBar::draw()
{
	if (!IsVisible)
		return;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return;

	video::SColor iconColor = skin->getColor(isEnabled() ? EGDC_WINDOW_SYMBOL : EGDC_GRAY_WINDOW_SYMBOL);
	if (iconColor != CurrentIconColor) {
		refreshControls();
	}

	SliderRect = AbsoluteRect;

	// draws the background
	skin->draw2DRectangle(this, skin->getColor(EGDC_SCROLLBAR), SliderRect, &AbsoluteClippingRect);

	if (core::isnotzero(range())) {
		// recalculate slider rectangle
		if (Horizontal) {
			SliderRect.UpperLeftCorner.X = AbsoluteRect.UpperLeftCorner.X + DrawPos + RelativeRect.getHeight() - DrawHeight / 2;
			SliderRect.LowerRightCorner.X = SliderRect.UpperLeftCorner.X + DrawHeight;
		} else {
			SliderRect.UpperLeftCorner.Y = AbsoluteRect.UpperLeftCorner.Y + DrawPos + RelativeRect.getWidth() - DrawHeight / 2;
			SliderRect.LowerRightCorner.Y = SliderRect.UpperLeftCorner.Y + DrawHeight;
		}

		skin->draw3DButtonPaneStandard(this, SliderRect, &AbsoluteClippingRect);
	}

	// draw buttons
	IGUIElement::draw();
}